

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::FileOptions::MergeFrom(FileOptions *this,FileOptions *from)

{
  uint uVar1;
  void *pvVar2;
  LogMessage *other;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x23ad);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
             &(from->uninterpreted_option_).super_RepeatedPtrFieldBase);
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      internal::ArenaStringPtr::AssignWithDefault
                (&this->java_package_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
                 (from->java_package_).ptr_);
    }
    if ((uVar1 & 2) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      internal::ArenaStringPtr::AssignWithDefault
                (&this->java_outer_classname_,
                 (string *)&internal::fixed_address_empty_string_abi_cxx11_,
                 (from->java_outer_classname_).ptr_);
    }
    if ((uVar1 & 4) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      internal::ArenaStringPtr::AssignWithDefault
                (&this->go_package_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
                 (from->go_package_).ptr_);
    }
    if ((uVar1 & 8) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      internal::ArenaStringPtr::AssignWithDefault
                (&this->objc_class_prefix_,
                 (string *)&internal::fixed_address_empty_string_abi_cxx11_,
                 (from->objc_class_prefix_).ptr_);
    }
    if ((uVar1 & 0x10) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
      internal::ArenaStringPtr::AssignWithDefault
                (&this->csharp_namespace_,(string *)&internal::fixed_address_empty_string_abi_cxx11_
                 ,(from->csharp_namespace_).ptr_);
    }
    if ((uVar1 & 0x20) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
      internal::ArenaStringPtr::AssignWithDefault
                (&this->swift_prefix_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
                 (from->swift_prefix_).ptr_);
    }
    if ((uVar1 & 0x40) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x40;
      internal::ArenaStringPtr::AssignWithDefault
                (&this->php_class_prefix_,(string *)&internal::fixed_address_empty_string_abi_cxx11_
                 ,(from->php_class_prefix_).ptr_);
    }
    if ((char)uVar1 < '\0') {
      this->java_multiple_files_ = from->java_multiple_files_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar1;
  }
  if ((uVar1 & 0xff00) != 0) {
    if ((uVar1 >> 8 & 1) != 0) {
      this->java_generate_equals_and_hash_ = from->java_generate_equals_and_hash_;
    }
    if ((uVar1 >> 9 & 1) != 0) {
      this->java_string_check_utf8_ = from->java_string_check_utf8_;
    }
    if ((uVar1 >> 10 & 1) != 0) {
      this->cc_generic_services_ = from->cc_generic_services_;
    }
    if ((uVar1 >> 0xb & 1) != 0) {
      this->java_generic_services_ = from->java_generic_services_;
    }
    if ((uVar1 >> 0xc & 1) != 0) {
      this->py_generic_services_ = from->py_generic_services_;
    }
    if ((uVar1 >> 0xd & 1) != 0) {
      this->deprecated_ = from->deprecated_;
    }
    if ((uVar1 >> 0xe & 1) != 0) {
      this->cc_enable_arenas_ = from->cc_enable_arenas_;
    }
    if ((short)uVar1 < 0) {
      this->optimize_for_ = from->optimize_for_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar1;
  }
  return;
}

Assistant:

void FileOptions::MergeFrom(const FileOptions& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FileOptions)
  GOOGLE_DCHECK_NE(&from, this);
  _extensions_.MergeFrom(from._extensions_);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  uninterpreted_option_.MergeFrom(from.uninterpreted_option_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 255u) {
    if (cached_has_bits & 0x00000001u) {
      set_has_java_package();
      java_package_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.java_package_);
    }
    if (cached_has_bits & 0x00000002u) {
      set_has_java_outer_classname();
      java_outer_classname_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.java_outer_classname_);
    }
    if (cached_has_bits & 0x00000004u) {
      set_has_go_package();
      go_package_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.go_package_);
    }
    if (cached_has_bits & 0x00000008u) {
      set_has_objc_class_prefix();
      objc_class_prefix_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.objc_class_prefix_);
    }
    if (cached_has_bits & 0x00000010u) {
      set_has_csharp_namespace();
      csharp_namespace_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.csharp_namespace_);
    }
    if (cached_has_bits & 0x00000020u) {
      set_has_swift_prefix();
      swift_prefix_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.swift_prefix_);
    }
    if (cached_has_bits & 0x00000040u) {
      set_has_php_class_prefix();
      php_class_prefix_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.php_class_prefix_);
    }
    if (cached_has_bits & 0x00000080u) {
      java_multiple_files_ = from.java_multiple_files_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  if (cached_has_bits & 65280u) {
    if (cached_has_bits & 0x00000100u) {
      java_generate_equals_and_hash_ = from.java_generate_equals_and_hash_;
    }
    if (cached_has_bits & 0x00000200u) {
      java_string_check_utf8_ = from.java_string_check_utf8_;
    }
    if (cached_has_bits & 0x00000400u) {
      cc_generic_services_ = from.cc_generic_services_;
    }
    if (cached_has_bits & 0x00000800u) {
      java_generic_services_ = from.java_generic_services_;
    }
    if (cached_has_bits & 0x00001000u) {
      py_generic_services_ = from.py_generic_services_;
    }
    if (cached_has_bits & 0x00002000u) {
      deprecated_ = from.deprecated_;
    }
    if (cached_has_bits & 0x00004000u) {
      cc_enable_arenas_ = from.cc_enable_arenas_;
    }
    if (cached_has_bits & 0x00008000u) {
      optimize_for_ = from.optimize_for_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}